

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# section.cpp
# Opt level: O2

int __thiscall section_data::calibrate_axes(section_data *this,int xx1,int yy1,int xx2,int yy2)

{
  int iVar1;
  ostream *poVar2;
  int iVar3;
  double dVar4;
  
  this->x1 = xx1;
  this->y1 = yy1;
  this->x2 = xx2;
  this->y2 = yy2;
  dVar4 = round(SQRT(((double)xx2 - (double)xx1) * ((double)xx2 - (double)xx1) +
                     ((double)yy2 - (double)yy1) * ((double)yy2 - (double)yy1)));
  this->xsec_distance = (int)dVar4;
  if (xx1 == xx2) {
    if (yy1 == yy2) {
      poVar2 = std::operator<<((ostream *)&std::cout,"Slicing between [");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->x1);
      poVar2 = std::operator<<(poVar2,", ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->y1);
      poVar2 = std::operator<<(poVar2,"] and [");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->x2);
      poVar2 = std::operator<<(poVar2,", ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->y2);
      poVar2 = std::operator<<(poVar2,"]");
      std::endl<char,std::char_traits<char>>(poVar2);
      std::operator<<((ostream *)&std::cout,"Error: Cannot slice on a single point.");
      return 1;
    }
    poVar2 = std::operator<<((ostream *)&std::cout,"Vertical cross-section");
    std::endl<char,std::char_traits<char>>(poVar2);
    this->axis_type = 3;
    iVar1 = this->y1;
    iVar3 = this->y2;
    if (iVar1 <= iVar3) goto LAB_00134844;
  }
  else {
    if (yy1 == yy2) {
      poVar2 = std::operator<<((ostream *)&std::cout,"Horizontal cross-section");
      std::endl<char,std::char_traits<char>>(poVar2);
      this->axis_type = 1;
      iVar1 = this->x2;
      if (iVar1 < this->x1) {
        this->x2 = this->x1;
        this->x1 = iVar1;
      }
      goto LAB_00134844;
    }
    poVar2 = std::operator<<((ostream *)&std::cout,"Diagonal cross-section");
    std::endl<char,std::char_traits<char>>(poVar2);
    this->axis_type = 2;
    iVar1 = this->x2;
    if (this->x1 <= iVar1) goto LAB_00134844;
    this->x2 = this->x1;
    this->x1 = iVar1;
    iVar1 = this->y1;
    iVar3 = this->y2;
  }
  this->y2 = iVar1;
  this->y1 = iVar3;
LAB_00134844:
  poVar2 = std::operator<<((ostream *)&std::cout,"Slicing between [");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->x1);
  poVar2 = std::operator<<(poVar2,", ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->y1);
  poVar2 = std::operator<<(poVar2,"] and [");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->x2);
  poVar2 = std::operator<<(poVar2,", ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->y2);
  poVar2 = std::operator<<(poVar2,"]");
  std::endl<char,std::char_traits<char>>(poVar2);
  return 0;
}

Assistant:

int section_data::calibrate_axes(int xx1, int yy1, int xx2, int yy2)
{
  x1 = xx1;
  y1 = yy1;
  x2 = xx2;
  y2 = yy2;
  xsec_distance =
      (int)round(sqrt(((double)x2 - (double)x1) * ((double)x2 - (double)x1) +
                      ((double)y2 - (double)y1) * ((double)y2 - (double)y1)));
  int holder;

  if ((x1 == x2) && (y1 == y2)) // Single point
  {
    cout << "Slicing between [" << x1 << ", " << y1 << "] and [" << x2 << ", "
         << y2 << "]" << endl;
    cout << "Error: Cannot slice on a single point.";
    return EXIT_FAILURE;
  } else if (y1 == y2) // Horizontal cross-section
  {
    cout << "Horizontal cross-section" << endl;
    axis_type = 1;
    if (x1 > x2) // Ensure x1 is always LE to x2
    {
      holder = x2;
      x2 = x1;
      x1 = holder;
    }
    cout << "Slicing between [" << x1 << ", " << y1 << "] and [" << x2 << ", "
         << y2 << "]" << endl;
    return EXIT_SUCCESS;
  } else if (x1 == x2) // Vertical cross-section
  {
    cout << "Vertical cross-section" << endl;
    axis_type = 3;
    if (y1 > y2) // Ensure y1 is always LE to y2
    {
      holder = y2;
      y2 = y1;
      y1 = holder;
    }
    cout << "Slicing between [" << x1 << ", " << y1 << "] and [" << x2 << ", "
         << y2 << "]" << endl;
    return EXIT_SUCCESS;
  } else if ((x1 != x2) && (y1 != y2)) {
    cout << "Diagonal cross-section" << endl;
    axis_type = 2;
    if (x1 > x2) // Ensure x1 is always LE to x2
    {
      holder = x2;
      x2 = x1;
      x1 = holder;
      holder = y2;
      y2 = y1;
      y1 = holder;
    }
    cout << "Slicing between [" << x1 << ", " << y1 << "] and [" << x2 << ", "
         << y2 << "]" << endl;
    return EXIT_SUCCESS;
  }
  return EXIT_FAILURE;
}